

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.h
# Opt level: O2

void __thiscall FxConstant::FxConstant(FxConstant *this,FName *val,FScriptPosition *pos)

{
  PName *pPVar1;
  
  FxExpression::FxExpression(&this->super_FxExpression,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_007e9480;
  (this->value).field_1.Int = 0;
  pPVar1 = TypeName;
  (this->value).Type = (PType *)TypeName;
  (this->super_FxExpression).ValueType = (PType *)pPVar1;
  (this->value).field_1.Int = val->Index;
  (this->super_FxExpression).isresolved = true;
  return;
}

Assistant:

FxConstant(FName val, const FScriptPosition &pos) : FxExpression(pos)
	{
		ValueType = value.Type = TypeName;
		value.Int = val;
		isresolved = true;
	}